

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O0

lvl_sounds * rest_lvl_sounds(memfile *mf)

{
  int8_t iVar1;
  int32_t iVar2;
  uint len_00;
  lvl_sound_bite *plVar3;
  char *pcVar4;
  int local_1c;
  uint len;
  int i;
  lvl_sounds *ls;
  memfile *mf_local;
  
  _len = (lvl_sounds *)0x0;
  mfmagic_check(mf,0x444e534c);
  iVar1 = mread8(mf);
  if (iVar1 != '\0') {
    _len = (lvl_sounds *)malloc(0x10);
    iVar2 = mread32(mf);
    _len->freq = iVar2;
    iVar2 = mread32(mf);
    _len->n_sounds = iVar2;
    _len->sounds = (lvl_sound_bite *)0x0;
    if (0 < _len->n_sounds) {
      plVar3 = (lvl_sound_bite *)malloc((long)_len->n_sounds << 4);
      _len->sounds = plVar3;
      for (local_1c = 0; local_1c < _len->n_sounds; local_1c = local_1c + 1) {
        mfmagic_check(mf,0x4253564c);
        iVar2 = mread32(mf);
        _len->sounds[local_1c].flags = iVar2;
        len_00 = mread32(mf);
        pcVar4 = (char *)malloc((ulong)len_00);
        _len->sounds[local_1c].msg = pcVar4;
        mread(mf,_len->sounds[local_1c].msg,len_00);
        _len->sounds[local_1c].msg[len_00 - 1] = '\0';
      }
    }
  }
  return _len;
}

Assistant:

static struct lvl_sounds *rest_lvl_sounds(struct memfile *mf)
{
	struct lvl_sounds *ls = NULL;

	mfmagic_check(mf, LVLSOUNDS_MAGIC);

	/* Check for level sounds marker. */
	if (mread8(mf)) {
	    ls = malloc(sizeof(*ls));
	    ls->freq = mread32(mf);
	    ls->n_sounds = mread32(mf);
	    ls->sounds = NULL;

	    if (ls->n_sounds > 0) {
		int i;

		ls->sounds = malloc(sizeof(struct lvl_sound_bite) * ls->n_sounds);
		for (i = 0; i < ls->n_sounds; i++) {
		    unsigned int len;

		    mfmagic_check(mf, LVLSOUNDBITE_MAGIC);

		    ls->sounds[i].flags = mread32(mf);
		    len = mread32(mf);
		    ls->sounds[i].msg = malloc(len);
		    mread(mf, ls->sounds[i].msg, len);
		    ls->sounds[i].msg[len - 1] = '\0';
		}
	    }
	}

	return ls;
}